

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall Sampling_TrimmedExponential_Test::TestBody(Sampling_TrimmedExponential_Test *this)

{
  Float max;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float *pfVar8;
  size_t sVar9;
  bool bVar10;
  uint uVar11;
  Allocator AVar12;
  byte bVar13;
  int iVar14;
  char *pcVar15;
  char *in_R9;
  uint64_t oldstate;
  undefined1 *puVar16;
  undefined1 auVar17 [16];
  float fVar18;
  Float FVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM6_Qb;
  span<const_float> f;
  Float c;
  AssertionResult gtest_ar_;
  Float dp;
  AssertionResult gtest_ar;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  PiecewiseConstant1D distrib;
  AssertHelper local_1a8;
  uint local_19c;
  long *local_198;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  undefined1 local_188 [16];
  float local_16c;
  undefined1 local_168 [24];
  string local_150;
  float local_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  _Any_data local_108;
  code *pcStack_f8;
  code *pcStack_f0;
  undefined1 *local_e0;
  long local_d8;
  AssertHelper local_d0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_c8;
  uint local_a8;
  Float aFStack_a4 [9];
  PiecewiseConstant1D local_80;
  
  aFStack_a4[1] = 0.0;
  aFStack_a4[4] = 0.0;
  aFStack_a4[7] = 0.0;
  _local_a8 = 0x400000003f800000;
  aFStack_a4[2] = 5.0;
  aFStack_a4[3] = 10.0;
  aFStack_a4[5] = 0.25;
  aFStack_a4[6] = 20.0;
  local_d8 = 0;
  local_e0 = &DAT_5851f42d4c957f2e;
  do {
    local_19c = *(uint *)((long)&local_a8 + local_d8);
    max = *(Float *)((long)aFStack_a4 + local_d8);
    local_108._8_8_ = 0;
    local_108._M_unused._M_object = &local_19c;
    pcStack_f8 = std::
                 _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:843:20)>
                 ::_M_manager;
    pcStack_f0 = std::
                 _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:843:20)>
                 ::_M_invoke;
    AVar12.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Sample1DFunction
              (&local_c8,(function<float_(float)> *)&local_108,0x8000,0x10,0.0,max,AVar12);
    if (pcStack_f8 != (code *)0x0) {
      (*pcStack_f8)(&local_108,&local_108,__destroy_functor);
    }
    sVar9 = local_c8.nStored;
    pfVar8 = local_c8.ptr;
    AVar12.memoryResource = pstd::pmr::new_delete_resource();
    f.n = sVar9;
    f.ptr = pfVar8;
    pbrt::PiecewiseConstant1D::PiecewiseConstant1D(&local_80,f,0.0,max,AVar12);
    iVar14 = 100;
    puVar16 = local_e0;
    do {
      uVar11 = (uint)((ulong)puVar16 >> 0x2d) ^ (uint)((ulong)puVar16 >> 0x1b);
      bVar13 = (byte)((ulong)puVar16 >> 0x3b);
      auVar1._8_8_ = in_XMM6_Qb;
      auVar1._0_8_ = in_XMM6_Qa;
      auVar17 = vcvtusi2ss_avx512f(auVar1,uVar11 >> bVar13 | uVar11 << 0x20 - bVar13);
      local_12c = auVar17._0_4_ * 2.3283064e-10;
      auVar17 = vminss_avx(ZEXT416((uint)local_12c),ZEXT416(0x3f7fffff));
      local_128._0_4_ = auVar17._0_4_;
      auVar17._8_4_ = 0x80000000;
      auVar17._0_8_ = 0x8000000080000000;
      auVar17._12_4_ = 0x80000000;
      local_188 = vxorps_avx512vl(ZEXT416(local_19c),auVar17);
      fVar18 = expf(local_188._0_4_ * max);
      auVar17 = vfnmadd132ss_fma(ZEXT416((uint)(1.0 - fVar18)),SUB6416(ZEXT464(0x3f800000),0),
                                 ZEXT416((uint)local_128._0_4_));
      fVar18 = logf(auVar17._0_4_);
      fVar18 = fVar18 / (float)local_188._0_4_;
      auVar7._12_4_ = 0;
      auVar7._0_12_ = local_168._4_12_;
      local_168._0_16_ = auVar7 << 0x20;
      local_188._0_4_ = fVar18;
      if ((0.0 <= fVar18) && (fVar18 <= max)) {
        local_168._0_16_ = ZEXT416(local_19c);
        auVar2._8_4_ = 0x80000000;
        auVar2._0_8_ = 0x8000000080000000;
        auVar2._12_4_ = 0x80000000;
        local_118 = vxorps_avx512vl(local_168._0_16_,auVar2);
        fVar18 = expf(local_118._0_4_ * max);
        local_168._0_4_ = (float)local_168._0_4_ / (1.0 - fVar18);
        fVar18 = expf((float)local_118._0_4_ * (float)local_188._0_4_);
        local_168._0_4_ = fVar18 * (float)local_168._0_4_;
      }
      FVar19 = pbrt::PiecewiseConstant1D::Sample
                         (&local_80,(Float)local_128._0_4_,&local_16c,(int *)0x0);
      local_118._0_4_ = FVar19;
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar17 = vandps_avx512vl(ZEXT416((uint)((float)local_188._0_4_ - FVar19)),auVar3);
      local_1a8.data_._0_4_ = auVar17._0_4_;
      local_198 = (long *)&DAT_3f847ae147ae147b;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&local_150,"std::abs(cx - dx)","1e-2",(float *)&local_1a8,
                 (double *)&local_198);
      if ((char)local_150._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_198 + 2),"Closed form = ",0xe);
        std::ostream::_M_insert<double>((double)(float)local_188._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_198 + 2),", distrib = ",0xc);
        std::ostream::_M_insert<double>((double)(float)local_118._0_4_);
        pcVar15 = "";
        if ((undefined8 *)local_150._M_string_length != (undefined8 *)0x0) {
          pcVar15 = *(char **)local_150._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x355,pcVar15);
        testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_198);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        if (local_198 != (long *)0x0) {
          bVar10 = testing::internal::IsTrue(true);
          if ((bVar10) && (local_198 != (long *)0x0)) {
            (**(code **)(*local_198 + 8))();
          }
          local_198 = (long *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_150._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      auVar4._8_4_ = 0x7fffffff;
      auVar4._0_8_ = 0x7fffffff7fffffff;
      auVar4._12_4_ = 0x7fffffff;
      auVar17 = vandps_avx512vl(ZEXT416((uint)((float)local_168._0_4_ - local_16c)),auVar4);
      local_1a8.data_._0_4_ = auVar17._0_4_;
      local_198 = (long *)&DAT_3f847ae147ae147b;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&local_150,"std::abs(cp - dp)","1e-2",(float *)&local_1a8,
                 (double *)&local_198);
      if ((char)local_150._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_198 + 2),"Closed form PDF = ",0x12);
        std::ostream::_M_insert<double>((double)(float)local_168._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_198 + 2),", distrib PDF = ",0x10);
        std::ostream::_M_insert<double>((double)local_16c);
        pcVar15 = "";
        if ((undefined8 *)local_150._M_string_length != (undefined8 *)0x0) {
          pcVar15 = *(char **)local_150._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x357,pcVar15);
        testing::internal::AssertHelper::operator=(&local_1a8,(Message *)&local_198);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        if (local_198 != (long *)0x0) {
          bVar10 = testing::internal::IsTrue(true);
          if ((bVar10) && (local_198 != (long *)0x0)) {
            (**(code **)(*local_198 + 8))();
          }
          local_198 = (long *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_150._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      auVar5._8_4_ = 0x80000000;
      auVar5._0_8_ = 0x8000000080000000;
      auVar5._12_4_ = 0x80000000;
      local_118 = vxorps_avx512vl(ZEXT416(local_19c),auVar5);
      fVar18 = expf(local_118._0_4_ * (float)local_188._0_4_);
      local_168._0_4_ = 1.0 - fVar18;
      fVar18 = expf((float)local_118._0_4_ * max);
      fVar20 = (float)local_168._0_4_ / (1.0 - fVar18);
      auVar1 = vminss_avx(ZEXT416((uint)local_12c),ZEXT416(0x3f7fffff));
      auVar21._8_4_ = 0x7fffffff;
      auVar21._0_8_ = 0x7fffffff7fffffff;
      auVar21._12_4_ = 0x7fffffff;
      auVar17 = vandps_avx(ZEXT416((uint)fVar20),auVar21);
      auVar17 = vminss_avx(auVar17,auVar1);
      bVar10 = auVar17._0_4_ < 0.01;
      fVar18 = (float)local_128._0_4_ - fVar20;
      auVar17 = vandps_avx(ZEXT416((uint)bVar10 * (int)fVar18 +
                                   (uint)!bVar10 *
                                   (int)((fVar18 + fVar18) / ((float)local_128._0_4_ + fVar20))),
                           auVar21);
      local_198 = (long *)CONCAT71(local_198._1_7_,auVar17._0_4_ <= 0.01);
      local_190.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (0.01 < auVar17._0_4_) {
        testing::Message::Message((Message *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_1a8.data_)->line,"u = ",4);
        std::ostream::_M_insert<double>((double)(float)local_128._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_1a8.data_)->line," -> x = ",8);
        std::ostream::_M_insert<double>((double)(float)local_188._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_1a8.data_)->line," -> ... ",8);
        auVar6._8_4_ = 0x80000000;
        auVar6._0_8_ = 0x8000000080000000;
        auVar6._12_4_ = 0x80000000;
        local_128 = vxorps_avx512vl(ZEXT416(local_19c),auVar6);
        fVar18 = expf(local_128._0_4_ * (float)local_188._0_4_);
        local_188._0_4_ = 1.0 - fVar18;
        fVar18 = expf((float)local_128._0_4_ * max);
        std::ostream::_M_insert<double>((double)((float)local_188._0_4_ / (1.0 - fVar18)));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_150,(internal *)&local_198,
                   (AssertionResult *)"checkErr(u, InvertTrimmedExponentialSample(cx, c, xMax))",
                   "true","false",in_R9);
        local_188._0_8_ = puVar16;
        testing::internal::AssertHelper::AssertHelper
                  (&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                   ,0x362,(char *)CONCAT71(local_150._M_dataplus._M_p._1_7_,
                                           (char)local_150._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_1a8);
        testing::internal::AssertHelper::~AssertHelper(&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_150._M_dataplus._M_p._1_7_,(char)local_150._M_dataplus._M_p) !=
            &local_150.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_150._M_dataplus._M_p._1_7_,(char)local_150._M_dataplus._M_p
                                  ),local_150.field_2._M_allocated_capacity + 1);
        }
        puVar16 = (undefined1 *)local_188._0_8_;
        if (local_1a8.data_ != (AssertHelperData *)0x0) {
          bVar10 = testing::internal::IsTrue(true);
          if ((bVar10) && (local_1a8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_1a8.data_ + 8))();
          }
          local_1a8.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_190,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      puVar16 = (undefined1 *)((long)puVar16 * 0x5851f42d4c957f2d + 1);
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
    local_80.cdf.nStored = 0;
    (*(local_80.cdf.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_80.cdf.alloc.memoryResource,local_80.cdf.ptr,local_80.cdf.nAlloc << 2,4);
    local_80.func.nStored = 0;
    (*(local_80.func.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_80.func.alloc.memoryResource,local_80.func.ptr,local_80.func.nAlloc << 2,4);
    local_c8.nStored = 0;
    (*(local_c8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_c8.alloc.memoryResource,local_c8.ptr,local_c8.nAlloc << 2,4);
    local_d8 = local_d8 + 0xc;
  } while (local_d8 != 0x24);
  return;
}

Assistant:

TEST(Sampling, TrimmedExponential) {
    Float params[][3] = {{1., 2.}, {5, 10}, {.25, 20}};
    for (const auto p : params) {
        Float c = p[0], xMax = p[1];
        auto exp = [&](Float x) { return std::exp(-c * x); };

        auto values = Sample1DFunction(exp, 32768, 16, 0, xMax);
        PiecewiseConstant1D distrib(values, 0, xMax);
        for (Float u : Uniform1D(100)) {
            Float cx = SampleTrimmedExponential(u, c, xMax);
            Float cp = TrimmedExponentialPDF(cx, c, xMax);

            Float dp;
            Float dx = distrib.Sample(u, &dp);
            EXPECT_LT(std::abs(cx - dx), 1e-2)
                << "Closed form = " << cx << ", distrib = " << dx;
            EXPECT_LT(std::abs(cp - dp), 1e-2)
                << "Closed form PDF = " << cp << ", distrib PDF = " << dp;

            auto checkErr = [](Float a, Float b) {
                Float err;
                if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                    err = std::abs(a - b);
                else
                    err = std::abs(2 * (a - b) / (a + b));
                return err > 1e-2;
            };
            EXPECT_FALSE(checkErr(u, InvertTrimmedExponentialSample(cx, c, xMax)))
                << "u = " << u << " -> x = " << cx << " -> ... "
                << InvertTrimmedExponentialSample(cx, c, xMax);
        }
    }
}